

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void bcemit_branch_t(FuncState *fs,ExpDesc *e)

{
  BCPos local_1c;
  BCPos pc;
  ExpDesc *e_local;
  FuncState *fs_local;
  
  expr_discharge(fs,e);
  if (((e->k == VKSTR) || (e->k == VKLAST)) || (e->k == VKTRUE)) {
    local_1c = 0xffffffff;
  }
  else if (e->k == VJMP) {
    invertcond(fs,e);
    local_1c = (e->u).s.info;
  }
  else if ((e->k == VKFALSE) || (e->k == VKNIL)) {
    expr_toreg_nobranch(fs,e,0xff);
    local_1c = bcemit_jmp(fs);
  }
  else {
    local_1c = bcemit_branch(fs,e,0);
  }
  jmp_append(fs,&e->f,local_1c);
  jmp_tohere(fs,e->t);
  e->t = 0xffffffff;
  return;
}

Assistant:

static void bcemit_branch_t(FuncState *fs, ExpDesc *e)
{
  BCPos pc;
  expr_discharge(fs, e);
  if (e->k == VKSTR || e->k == VKNUM || e->k == VKTRUE)
    pc = NO_JMP;  /* Never jump. */
  else if (e->k == VJMP)
    invertcond(fs, e), pc = e->u.s.info;
  else if (e->k == VKFALSE || e->k == VKNIL)
    expr_toreg_nobranch(fs, e, NO_REG), pc = bcemit_jmp(fs);
  else
    pc = bcemit_branch(fs, e, 0);
  jmp_append(fs, &e->f, pc);
  jmp_tohere(fs, e->t);
  e->t = NO_JMP;
}